

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyMessageImpl *
formatEncodingReport
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  ctmbstr ptVar3;
  ctmbstr ptVar4;
  uint messageType;
  int *local_98;
  uint *local_80;
  ctmbstr action;
  Bool discarded;
  uint c;
  char buf [32];
  __va_list_tag *args_local;
  uint level_local;
  uint code_local;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  buf._24_8_ = args;
  memset(&discarded,0,0x20);
  uVar1 = *(uint *)buf._24_8_;
  if (uVar1 < 0x29) {
    local_80 = (uint *)((long)(int)uVar1 + *(long *)(buf._24_8_ + 0x10));
    *(uint *)buf._24_8_ = uVar1 + 8;
  }
  else {
    local_80 = *(uint **)(buf._24_8_ + 8);
    *(uint **)(buf._24_8_ + 8) = local_80 + 2;
  }
  uVar1 = *local_80;
  uVar2 = *(uint *)buf._24_8_;
  if (uVar2 < 0x29) {
    local_98 = (int *)((long)(int)uVar2 + *(long *)(buf._24_8_ + 0x10));
    *(uint *)buf._24_8_ = uVar2 + 8;
  }
  else {
    local_98 = *(int **)(buf._24_8_ + 8);
    *(int **)(buf._24_8_ + 8) = local_98 + 2;
  }
  messageType = 0x1fd;
  if (*local_98 != 0) {
    messageType = 0x1f7;
  }
  ptVar3 = tidyLocalizedString(messageType);
  if (code == 0x23b) {
    doc->badChars = doc->badChars | 0x10;
    ptVar3 = prvTidyCharEncodingName(doc->docIn->encoding);
    ptVar4 = prvTidyCharEncodingName(uVar1);
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithLexer(doc,0x23b,level,ptVar3,ptVar4);
  }
  else {
    if (code == 0x249) {
      NtoS(uVar1,(tmbstr)&discarded);
      doc->badChars = doc->badChars | 0x40;
    }
    else if (code == 0x24a) {
      NtoS(uVar1,(tmbstr)&discarded);
      doc->badChars = doc->badChars | 2;
    }
    else if (code == 0x24b) {
      prvTidytmbsnprintf((tmbstr)&discarded,0x20,"U+%04X",(ulong)uVar1);
      doc->badChars = doc->badChars | 4;
    }
    else if (code == 0x24c) {
      prvTidytmbsnprintf((tmbstr)&discarded,0x20,"U+%04X",(ulong)uVar1);
      doc->badChars = doc->badChars | 8;
    }
    else if (code == 0x28f) {
      NtoS(uVar1,(tmbstr)&discarded);
      doc->badChars = doc->badChars | 1;
    }
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithLexer(doc,code,level,ptVar3,&discarded);
  }
  return (TidyMessageImpl *)doc_local;
}

Assistant:

TidyMessageImpl *formatEncodingReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char buf[ 32 ] = {'\0'};
    uint c = va_arg( args, uint );
    Bool discarded = va_arg( args, Bool );
    ctmbstr action = tidyLocalizedString(discarded ? STRING_DISCARDING : STRING_REPLACING);

    switch (code)
    {
        case INVALID_NCR:
            NtoS(c, buf);
            doc->badChars |= BC_INVALID_NCR;
            break;

        case INVALID_SGML_CHARS:
            NtoS(c, buf);
            doc->badChars |= BC_INVALID_SGML_CHARS;
            break;

        case INVALID_UTF8:
            TY_(tmbsnprintf)(buf, sizeof(buf), "U+%04X", c);
            doc->badChars |= BC_INVALID_UTF8;
            break;

        case INVALID_UTF16:
            TY_(tmbsnprintf)(buf, sizeof(buf), "U+%04X", c);
            doc->badChars |= BC_INVALID_UTF16;
            break;

        case VENDOR_SPECIFIC_CHARS:
            NtoS(c, buf);
            doc->badChars |= BC_VENDOR_SPECIFIC_CHARS;
            break;

        case ENCODING_MISMATCH:
            doc->badChars |= BC_ENCODING_MISMATCH;
            return TY_(tidyMessageCreateWithLexer)(doc,
                                                   code,
                                                   level,
                                                   TY_(CharEncodingName)(doc->docIn->encoding),
                                                   TY_(CharEncodingName)(c));
            break;
    }

    return TY_(tidyMessageCreateWithLexer)(doc, code, level, action, buf );

}